

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

Symbol __thiscall
google::protobuf::DescriptorBuilder::FindSymbol(DescriptorBuilder *this,string *name,bool build_it)

{
  _Rb_tree_header *p_Var1;
  pointer file;
  undefined1 auVar2 [16];
  bool bVar3;
  FileDescriptor *pFVar4;
  _Base_ptr p_Var5;
  DescriptorBuilder *pDVar6;
  _Base_ptr p_Var7;
  DescriptorBuilder *this_00;
  DescriptorBuilder *pDVar8;
  Symbol SVar9;
  undefined1 auVar10 [16];
  Symbol result;
  Type local_38;
  anon_union_8_8_13f84498_for_Symbol_2 local_30;
  undefined1 auVar11 [16];
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined8 uVar14;
  undefined8 uVar15;
  
  this_00 = (DescriptorBuilder *)&stack0xffffffffffffffc8;
  SVar9 = FindSymbolNotEnforcingDeps(this,name,build_it);
  local_30 = SVar9.field_1;
  local_38 = SVar9.type;
  if (local_38 == NULL_SYMBOL) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_30;
    SVar9 = (Symbol)(auVar2 << 0x40);
    auVar10._0_4_ = SVar9.type;
    auVar12._4_4_ = SVar9._4_4_;
    register0x00000010 = SVar9.field_1;
    return (Symbol)auVar10;
  }
  if (this->pool_->enforce_dependencies_ != true) {
    auVar11._0_4_ = SVar9.type;
    auVar13._4_4_ = SVar9._4_4_;
    register0x00000010 = SVar9.field_1;
    return (Symbol)auVar11;
  }
  pFVar4 = Symbol::GetFile((Symbol *)&stack0xffffffffffffffc8);
  if (pFVar4 == this->file_) {
LAB_002d495f:
    SVar9._4_4_ = 0;
    SVar9.type = local_38;
    SVar9.field_1.descriptor = local_30.descriptor;
  }
  else {
    p_Var5 = (this->dependencies_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var1 = &(this->dependencies_)._M_t._M_impl.super__Rb_tree_header;
    p_Var7 = &p_Var1->_M_header;
    if (p_Var5 != (_Base_ptr)0x0) {
      do {
        if (*(FileDescriptor **)(p_Var5 + 1) >= pFVar4) {
          p_Var7 = p_Var5;
        }
        p_Var5 = (&p_Var5->_M_left)[*(FileDescriptor **)(p_Var5 + 1) < pFVar4];
      } while (p_Var5 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var7 != p_Var1) && (*(FileDescriptor **)(p_Var7 + 1) <= pFVar4))
      goto LAB_002d495f;
    }
    if (local_38 == PACKAGE) {
      bVar3 = IsInPackage(this_00,this->file_,name);
      if (bVar3) goto LAB_002d495f;
      pDVar6 = (DescriptorBuilder *)
               (this->dependencies_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      while (pDVar8 = pDVar6, pDVar8 != (DescriptorBuilder *)p_Var1) {
        file = (pDVar8->options_to_interpret_).
               super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
               ._M_impl.super__Vector_impl_data._M_finish;
        if ((file != (pointer)0x0) &&
           (bVar3 = IsInPackage(this_00,(FileDescriptor *)file,name), bVar3)) goto LAB_002d495f;
        pDVar6 = (DescriptorBuilder *)std::_Rb_tree_increment((_Rb_tree_node_base *)pDVar8);
        this_00 = pDVar8;
      }
    }
    this->possible_undeclared_dependency_ = pFVar4;
    std::__cxx11::string::_M_assign((string *)&this->possible_undeclared_dependency_name_);
    SVar9._4_4_ = 0;
    SVar9.type = (anonymous_namespace)::kNullSymbol;
    SVar9.field_1.descriptor = DAT_007e50d0.descriptor;
  }
  return SVar9;
}

Assistant:

Symbol DescriptorBuilder::FindSymbol(const std::string& name, bool build_it) {
  Symbol result = FindSymbolNotEnforcingDeps(name, build_it);

  if (result.IsNull()) return result;

  if (!pool_->enforce_dependencies_) {
    // Hack for CompilerUpgrader, and also used for lazily_build_dependencies_
    return result;
  }

  // Only find symbols which were defined in this file or one of its
  // dependencies.
  const FileDescriptor* file = result.GetFile();
  if (file == file_ || dependencies_.count(file) > 0) {
    return result;
  }

  if (result.type == Symbol::PACKAGE) {
    // Arg, this is overcomplicated.  The symbol is a package name.  It could
    // be that the package was defined in multiple files.  result.GetFile()
    // returns the first file we saw that used this package.  We've determined
    // that that file is not a direct dependency of the file we are currently
    // building, but it could be that some other file which *is* a direct
    // dependency also defines the same package.  We can't really rule out this
    // symbol unless none of the dependencies define it.
    if (IsInPackage(file_, name)) return result;
    for (std::set<const FileDescriptor*>::const_iterator it =
             dependencies_.begin();
         it != dependencies_.end(); ++it) {
      // Note:  A dependency may be nullptr if it was not found or had errors.
      if (*it != nullptr && IsInPackage(*it, name)) return result;
    }
  }

  possible_undeclared_dependency_ = file;
  possible_undeclared_dependency_name_ = name;
  return kNullSymbol;
}